

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O2

int64_t __thiscall
aeron::DriverProxy::addExclusivePublication(DriverProxy *this,string *channel,int32_t streamId)

{
  long *plVar1;
  int32_t streamId_local;
  int64_t correlationId;
  anon_class_32_4_8d18ef1a local_28;
  
  local_28.streamId = &streamId_local;
  LOCK();
  plVar1 = (long *)(this->m_toDriverCommandBuffer->m_buffer->m_buffer +
                   this->m_toDriverCommandBuffer->m_correlationIdCounterIndex);
  correlationId = *plVar1;
  *plVar1 = *plVar1 + 1;
  UNLOCK();
  local_28.correlationId = &correlationId;
  streamId_local = streamId;
  local_28.this = this;
  local_28.channel = channel;
  writeCommandToDriver<aeron::DriverProxy::addExclusivePublication(std::__cxx11::string_const&,int)::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (this,&local_28);
  return correlationId;
}

Assistant:

std::int64_t addExclusivePublication(const std::string& channel, std::int32_t streamId)
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer &buffer, util::index_t &length)
        {
            PublicationMessageFlyweight publicationMessage(buffer, 0);

            publicationMessage.clientId(m_clientId);
            publicationMessage.correlationId(correlationId);
            publicationMessage.streamId(streamId);
            publicationMessage.channel(channel);

            length = publicationMessage.length();

            return ControlProtocolEvents::ADD_EXCLUSIVE_PUBLICATION;
        });

        return correlationId;
    }